

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall RandStrAtom::RandStrAtom(RandStrAtom *this,RandStrParser *p)

{
  RandStrNode **ppRVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  int iVar4;
  RandStrNode *pRVar5;
  RandStrNode *pRVar6;
  int iVar7;
  wchar_t wVar8;
  RandStrNode **ppRVar9;
  
  (this->super_RandStrNode).firstChild = (RandStrNode *)0x0;
  (this->super_RandStrNode).lastChild = (RandStrNode *)0x0;
  (this->super_RandStrNode).nextSibling = (RandStrNode *)0x0;
  this->ch = L'\0';
  this->isLit = 0;
  (this->super_RandStrNode)._vptr_RandStrNode = (_func_int **)&PTR__RandStrNode_003590e0;
  this->listChars = 0;
  wVar2 = RandStrParser::getch(p);
  if (wVar2 == L'[') {
    RandStrParser::skip(p);
    ppRVar1 = &(this->super_RandStrNode).firstChild;
    while (p->rem != 0) {
      wVar2 = RandStrParser::getch(p);
      if (wVar2 == L']') break;
      wVar2 = RandStrParser::getch(p);
      if (wVar2 == L'%') {
        RandStrParser::skip(p);
        wVar2 = L'%';
        if (p->rem != 0) {
          wVar2 = RandStrParser::getch(p);
        }
      }
      RandStrParser::skip(p);
      wVar3 = RandStrParser::getch(p);
      if (wVar3 == L'-') {
        RandStrParser::skip(p);
        wVar3 = RandStrParser::getch(p);
        if (wVar3 == L'%') {
          RandStrParser::skip(p);
        }
        wVar3 = wVar2;
        if (p->rem != 0) {
          wVar3 = RandStrParser::getch(p);
        }
        RandStrParser::skip(p);
        pRVar5 = (RandStrNode *)operator_new(0x28);
        pRVar5->nextSibling = (RandStrNode *)0x0;
        pRVar5->firstChild = (RandStrNode *)0x0;
        pRVar5->lastChild = (RandStrNode *)0x0;
        iVar7 = wVar3 - wVar2;
        wVar8 = wVar2;
        if (wVar3 < wVar2) {
          wVar8 = wVar3;
        }
        if (iVar7 != 0 && wVar2 <= wVar3) {
          wVar2 = wVar3;
        }
        pRVar5->_vptr_RandStrNode = (_func_int **)&PTR__RandStrNode_00359128;
        *(wchar_t *)&pRVar5[1]._vptr_RandStrNode = wVar8;
        *(wchar_t *)((long)&pRVar5[1]._vptr_RandStrNode + 4) = wVar2;
        pRVar6 = (this->super_RandStrNode).lastChild;
        ppRVar9 = &pRVar6->nextSibling;
        if (pRVar6 == (RandStrNode *)0x0) {
          ppRVar9 = ppRVar1;
        }
        *ppRVar9 = pRVar5;
        (this->super_RandStrNode).lastChild = pRVar5;
        iVar4 = -iVar7;
        if (0 < iVar7) {
          iVar4 = iVar7;
        }
        iVar4 = iVar4 + this->listChars;
      }
      else {
        pRVar6 = (RandStrNode *)operator_new(0x28);
        pRVar6->firstChild = (RandStrNode *)0x0;
        pRVar6->lastChild = (RandStrNode *)0x0;
        pRVar6->nextSibling = (RandStrNode *)0x0;
        pRVar6->_vptr_RandStrNode = (_func_int **)&PTR__RandStrNode_00359128;
        *(wchar_t *)&pRVar6[1]._vptr_RandStrNode = wVar2;
        *(wchar_t *)((long)&pRVar6[1]._vptr_RandStrNode + 4) = wVar2;
        pRVar5 = (this->super_RandStrNode).lastChild;
        ppRVar9 = &pRVar5->nextSibling;
        if (pRVar5 == (RandStrNode *)0x0) {
          ppRVar9 = ppRVar1;
        }
        *ppRVar9 = pRVar6;
        (this->super_RandStrNode).lastChild = pRVar6;
        iVar4 = this->listChars;
      }
      this->listChars = iVar4 + 1;
    }
  }
  else {
    wVar2 = RandStrParser::getch(p);
    if (wVar2 == L'%') {
      RandStrParser::skip(p);
      if (p->rem == 0) {
        wVar2 = L'%';
      }
      else {
        wVar2 = RandStrParser::getch(p);
      }
      this->ch = wVar2;
      this->isLit = 1;
    }
    else {
      wVar2 = RandStrParser::getch(p);
      this->ch = wVar2;
    }
  }
  RandStrParser::skip(p);
  return;
}

Assistant:

RandStrAtom(class RandStrParser *p)
    {
        /* we don't have a character class or literal character yet */
        ch = 0;
        isLit = FALSE;
        
        /* we have no character list items yet */
        listChars = 0;
        
        /* check for a character list of the form [abcw-z] */
        if (p->getch() == '[')
        {
            /* keep going until we reach the ']' or end of string */
            for (p->skip() ; p->more() && p->getch() != ']' ; )
            {
                /* get the next character */
                wchar_t c1 = p->getch();

                /* check for quoting */
                if (c1 == '%')
                {
                    /* skip the '%' and get the quoted character */
                    p->skip();
                    c1 = (p->more() ? p->getch() : '%');
                }

                /* skip the character */
                p->skip();

                /* if the next character is '-', we have a range expression */
                if (p->getch() == '-')
                {
                    /* skip the '-' */
                    p->skip();

                    /* if there's a '%', skip it as well */
                    if (p->getch() == '%')
                        p->skip();

                    /* get the upper bound character */
                    wchar_t c2 = (p->more() ? p->getch() : c1);

                    /* skip the second character */
                    p->skip();

                    /* add the range */
                    addChild(new RandStrRange(c1, c2));
                    listChars += (c2 > c1 ? c2 - c1 : c1 - c2) + 1;
                }
                else
                {
                    /* it's just this character in the range */
                    addChild(new RandStrRange(c1, c1));
                    listChars += 1;
                }
            }

            /* skip the ']' */
            p->skip();
        }
        else if (p->getch() == '%')
        {
            /* 
             *   quoted character expression - skip the '%' and store the
             *   single character 
             */
            p->skip();
            ch = p->more() ? p->getch() : '%';

            /* note that this is a literal character expression */
            isLit = TRUE;

            /* skip the character */
            p->skip();
        }
        else
        {
            /* character class expression - store it and skip it */
            ch = p->getch();
            p->skip();
        }
    }